

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O1

string * soul::makeSafeIdentifierName(string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *c;
  char *pcVar7;
  string *__range1;
  char *pcVar8;
  long lVar9;
  char cVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (s->_M_string_length != 0) {
    pcVar7 = (s->_M_dataplus)._M_p;
    pcVar6 = pcVar7 + s->_M_string_length;
    do {
      lVar9 = 1;
      cVar2 = ' ';
      do {
        cVar10 = cVar2;
        if (cVar10 == *pcVar7) goto LAB_0019d5f9;
        pcVar8 = " ,./;" + lVar9;
        lVar9 = lVar9 + 1;
        cVar2 = *pcVar8;
      } while (lVar9 != 6);
      if (cVar10 == *pcVar7) {
LAB_0019d5f9:
        *pcVar7 = '_';
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar6);
  }
  pcVar6 = (s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  pcVar7 = pcVar6 + uVar3;
  pcVar8 = pcVar6;
  if (0 < (long)uVar3 >> 2) {
    pcVar8 = pcVar6 + (uVar3 & 0xfffffffffffffffc);
    lVar9 = ((long)uVar3 >> 2) + 1;
    pcVar6 = pcVar6 + 3;
    do {
      cVar2 = pcVar6[-3];
      if ((((0x19 < (byte)(cVar2 + 0x9fU)) && ((byte)(cVar2 - 0x3aU) < 0xf6)) && (cVar2 != '_')) &&
         ((byte)(cVar2 + 0xa5U) < 0xe6)) {
        pcVar6 = pcVar6 + -3;
        goto LAB_0019d79a;
      }
      cVar2 = pcVar6[-2];
      if (((0x19 < (byte)(cVar2 + 0x9fU)) && ((byte)(cVar2 - 0x3aU) < 0xf6)) &&
         ((cVar2 != '_' && ((byte)(cVar2 + 0xa5U) < 0xe6)))) {
        pcVar6 = pcVar6 + -2;
        goto LAB_0019d79a;
      }
      cVar2 = pcVar6[-1];
      if (((0x19 < (byte)(cVar2 + 0x9fU)) && ((byte)(cVar2 - 0x3aU) < 0xf6)) &&
         ((cVar2 != '_' && ((byte)(cVar2 + 0xa5U) < 0xe6)))) {
        pcVar6 = pcVar6 + -1;
        goto LAB_0019d79a;
      }
      cVar2 = *pcVar6;
      if ((((0x19 < (byte)(cVar2 + 0x9fU)) && ((byte)(cVar2 - 0x3aU) < 0xf6)) && (cVar2 != '_')) &&
         ((byte)(cVar2 + 0xa5U) < 0xe6)) goto LAB_0019d79a;
      lVar9 = lVar9 + -1;
      pcVar6 = pcVar6 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar7 - (long)pcVar8;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      pcVar6 = pcVar7;
      if ((lVar9 != 3) ||
         (((cVar2 = *pcVar8, 0x19 < (byte)(cVar2 + 0x9fU) && ((byte)(cVar2 - 0x3aU) < 0xf6)) &&
          ((cVar2 != '_' && (pcVar6 = pcVar8, (byte)(cVar2 + 0xa5U) < 0xe6)))))) goto LAB_0019d79a;
      pcVar8 = pcVar8 + 1;
    }
    cVar2 = *pcVar8;
    if (((0x19 < (byte)(cVar2 + 0x9fU)) && ((byte)(cVar2 - 0x3aU) < 0xf6)) &&
       ((cVar2 != '_' && (pcVar6 = pcVar8, (byte)(cVar2 + 0xa5U) < 0xe6)))) goto LAB_0019d79a;
    pcVar8 = pcVar8 + 1;
  }
  cVar2 = *pcVar8;
  pcVar6 = pcVar7;
  if (((0x19 < (byte)(cVar2 + 0x9fU)) && (cVar2 != '_' && 0x19 < (byte)(cVar2 + 0xbfU))) &&
     (pcVar6 = pcVar8, 0xf5 < (byte)(cVar2 - 0x3aU))) {
    pcVar6 = pcVar7;
  }
LAB_0019d79a:
  pcVar8 = pcVar6 + 1;
  if (pcVar8 != pcVar7 && pcVar6 != pcVar7) {
    do {
      cVar2 = *pcVar8;
      if ((((byte)(cVar2 + 0x9fU) < 0x1a) || (0xf5 < (byte)(cVar2 - 0x3aU))) ||
         ((cVar2 == '_' || (0xe5 < (byte)(cVar2 + 0xa5U))))) {
        *pcVar6 = cVar2;
        pcVar6 = pcVar6 + 1;
      }
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 != pcVar7);
  }
  s->_M_string_length = (long)pcVar6 - (long)(s->_M_dataplus)._M_p;
  *pcVar6 = '\0';
  if ((byte)(*(s->_M_dataplus)._M_p - 0x30U) < 10) {
    std::operator+(&local_38,"_",s);
    std::__cxx11::string::operator=((string *)s,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&s->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string makeSafeIdentifierName (std::string s)
{
    for (auto& c : s)
        if (containsChar (" ,./;", c))
            c = '_';

    s.erase (std::remove_if (s.begin(), s.end(), [&] (char c) { return ! isSafeIdentifierChar (c); }), s.end());

    // Identifiers can't start with a digit
    if (isDigit (s[0]))
        s = "_" + s;

    return s;
}